

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlayout.cpp
# Opt level: O0

QSpacerItem *
QLayoutPrivate::createSpacerItem(QLayout *layout,int w,int h,Policy hPolicy,Policy vPolicy)

{
  QSpacerItem *pQVar1;
  Policy in_ECX;
  int in_EDX;
  int in_ESI;
  QLayout *in_RDI;
  Policy in_R8D;
  QSpacerItem *si;
  undefined8 in_stack_ffffffffffffffd8;
  
  if (spacerItemFactoryMethod != (QSpacerItemFactoryMethod)0x0) {
    pQVar1 = (*spacerItemFactoryMethod)(in_RDI,in_ESI,in_EDX,in_ECX,in_R8D);
    if (pQVar1 != (QSpacerItem *)0x0) {
      return pQVar1;
    }
    in_stack_ffffffffffffffd8 = 0;
  }
  pQVar1 = (QSpacerItem *)operator_new(0x28);
  QSpacerItem::QSpacerItem
            ((QSpacerItem *)CONCAT44(in_ECX,in_R8D),(int)((ulong)in_stack_ffffffffffffffd8 >> 0x20),
             (int)in_stack_ffffffffffffffd8,(Policy)((ulong)pQVar1 >> 0x20),(Policy)pQVar1);
  return pQVar1;
}

Assistant:

QSpacerItem *QLayoutPrivate::createSpacerItem(const QLayout *layout, int w, int h, QSizePolicy::Policy hPolicy, QSizePolicy::Policy vPolicy)
{
    if (spacerItemFactoryMethod)
        if (QSpacerItem *si = (*spacerItemFactoryMethod)(layout, w, h, hPolicy, vPolicy))
            return si;
    return new QSpacerItem(w, h,  hPolicy, vPolicy);
}